

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eventThreadTest.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  TestClass *this;
  
  TimerManager::getInstance();
  this = (TestClass *)
         operator_new(0x1f0,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/eventThreadTest.cpp"
                      ,0xaa);
  TestClass::TestClass(this);
  TestClass::Func1(this);
  TestClass::Func2(this,1,2);
  TestClass::Func3(this,3);
  TestClass::end(this,1);
  TestClass::end(this,2);
  sleep(3);
  TestClass::~TestClass(this);
  operator_delete(this,0x1f0);
  if (gEventCount != 0) {
    jh_log_print(1,"int main(int, char **)",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/eventThreadTest.cpp"
                 ,0xbe,"Events leaked %d");
  }
  return 0;
}

Assistant:

int main( int argc, char*argv[] )
{
	LOG_NOTICE( "Test Started" );

	TimerManager* timer = TimerManager::getInstance();
	
	TestClass *c = jh_new TestClass;
	
	c->Func1();
	c->Func2( 1, 2 );
	c->Func3( 3 );

	c->end( 1 );
	c->end( 2 );
	
	//c->cancel();
	
	LOG_NOTICE( "Event Count is %d", gEventCount );
	
	sleep( 3 );
	
	delete c;
	
	LOG_NOTICE( "Event Count is %d", gEventCount );
	
	if ( gEventCount != 0 )
		LOG_ERR_FATAL( "Events leaked %d", gEventCount );
	
	return 0;
}